

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBatchInsert::GetGlobalSinkState(PhysicalBatchInsert *this,ClientContext *context)

{
  CatalogTransaction transaction;
  bool bVar1;
  TableCatalogEntry *pTVar2;
  ClientContext *in_RDX;
  SchemaCatalogEntry *in_RSI;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> in_RDI;
  templated_unique_single_t result;
  idx_t minimum_memory_per_thread;
  optional_ptr<duckdb::CatalogEntry,_true> created_table;
  Catalog *catalog;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  ClientContext *in_stack_ffffffffffffff28;
  CatalogEntry *in_stack_ffffffffffffff30;
  unsigned_long *in_stack_ffffffffffffff48;
  DuckTableEntry *in_stack_ffffffffffffff50;
  Catalog *in_stack_ffffffffffffff88;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_68;
  optional_ptr<duckdb::TableCatalogEntry,_true> in_stack_ffffffffffffffa0;
  ClientContext *in_stack_ffffffffffffffa8;
  CatalogEntry *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  transaction_t in_stack_ffffffffffffffc0;
  unsigned_long *local_38;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_20;
  ClientContext *local_18;
  
  local_18 = in_RDX;
  optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr(&local_20);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                      *)0x18638d7);
  if (bVar1) {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)in_stack_ffffffffffffff30);
    Catalog::GetCatalogTransaction((Catalog *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::get_mutable
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
               &(in_RSI->super_InCatalogEntry).super_CatalogEntry.tags._M_h._M_rehash_policy.
                _M_next_resize);
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffffa8;
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
    ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                 *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 = in_stack_ffffffffffffffb0;
    transaction.context.ptr = in_stack_ffffffffffffff28;
    transaction.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffffa0.ptr;
    transaction.transaction.ptr = (Transaction *)in_stack_ffffffffffffff30;
    transaction.transaction_id = in_stack_ffffffffffffffb8;
    transaction.start_time = in_stack_ffffffffffffffc0;
    Catalog::CreateTable
              (in_stack_ffffffffffffff88,transaction,in_RSI,
               (BoundCreateTableInfo *)in_RDI._M_head_impl);
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff30);
    pTVar2 = CatalogEntry::Cast<duckdb::TableCatalogEntry>(in_stack_ffffffffffffff30);
    optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr
              ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&stack0xffffffffffffffa0,pTVar2);
    in_stack_ffffffffffffff48 = local_38;
    local_20.ptr = in_stack_ffffffffffffffa0.ptr;
  }
  else {
    pTVar2 = optional_ptr<duckdb::TableCatalogEntry,_true>::get_mutable
                       ((optional_ptr<duckdb::TableCatalogEntry,_true> *)
                        &(in_RSI->super_InCatalogEntry).super_CatalogEntry.comment.value_info_);
    optional_ptr<duckdb::TableCatalogEntry,_true>::optional_ptr(&local_68,pTVar2);
    local_20.ptr = local_68.ptr;
  }
  pTVar2 = optional_ptr<duckdb::TableCatalogEntry,_true>::operator->
                     ((optional_ptr<duckdb::TableCatalogEntry,_true> *)in_stack_ffffffffffffff30);
  TableCatalogEntry::GetColumns(pTVar2);
  ColumnList::PhysicalColumnCount((ColumnList *)0x1863a0a);
  optional_ptr<duckdb::TableCatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::TableCatalogEntry,_true> *)in_stack_ffffffffffffff30);
  CatalogEntry::Cast<duckdb::DuckTableEntry>(in_stack_ffffffffffffff30);
  make_uniq<duckdb::BatchInsertGlobalState,duckdb::ClientContext&,duckdb::DuckTableEntry&,unsigned_long&>
            (local_18,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>,true>::
  unique_ptr<duckdb::BatchInsertGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>>>,void>
            ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff30,
             (unique_ptr<duckdb::BatchInsertGlobalState,_std::default_delete<duckdb::BatchInsertGlobalState>_>
              *)in_stack_ffffffffffffff28);
  unique_ptr<duckdb::BatchInsertGlobalState,_std::default_delete<duckdb::BatchInsertGlobalState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BatchInsertGlobalState,_std::default_delete<duckdb::BatchInsertGlobalState>,_true>
                 *)0x1863a65);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         )in_RDI._M_head_impl;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBatchInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		auto created_table = catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info);
		table = &created_table->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	// heuristic - we start off by allocating 4MB of cache space per column
	static constexpr const idx_t MINIMUM_MEMORY_PER_COLUMN = 4ULL * 1024ULL * 1024ULL;
	auto minimum_memory_per_thread = table->GetColumns().PhysicalColumnCount() * MINIMUM_MEMORY_PER_COLUMN;
	auto result = make_uniq<BatchInsertGlobalState>(context, table->Cast<DuckTableEntry>(), minimum_memory_per_thread);
	return std::move(result);
}